

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O3

ssize_t uudecode_filter_read(archive_read_filter *self,void **buff)

{
  long lVar1;
  uudecode *uudecode;
  int iVar2;
  uint uVar3;
  byte *b;
  size_t size;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  byte *pbVar9;
  byte bVar10;
  int iVar11;
  archive_read *a;
  size_t sVar12;
  size_t sVar13;
  bool bVar14;
  ssize_t avail_in;
  ssize_t nl;
  long local_70;
  uchar *local_68;
  size_t local_50;
  size_t local_48;
  void **local_40;
  long local_38;
  
  uudecode = (uudecode *)self->data;
  b = (byte *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_50);
  bVar14 = b == (byte *)0x0;
  local_40 = buff;
  if (!bVar14 || -1 < (long)local_50) {
    do {
      if (bVar14) {
        local_50 = 0;
      }
      local_48 = local_50;
      if (uudecode->state == 4) {
        local_70 = 0;
        sVar12 = local_50;
        sVar13 = local_50;
LAB_0013ef7e:
        lVar6 = 0;
        if ((long)local_48 < (long)sVar12) {
          lVar6 = local_48 - sVar12;
        }
        __archive_read_filter_consume(self->upstream,lVar6 + sVar13);
        *local_40 = uudecode->out_buff;
        uudecode->total = uudecode->total + local_70;
        return local_70;
      }
      local_68 = uudecode->out_buff;
      if ((long)uudecode->in_cnt != 0) {
        iVar2 = ensure_in_buff_size(self,uudecode,(long)uudecode->in_cnt + local_50);
        if (iVar2 != 0) {
          return -0x1e;
        }
        memcpy(uudecode->in_buff + uudecode->in_cnt,b,local_50);
        b = uudecode->in_buff;
        local_50 = (long)uudecode->in_cnt + local_50;
        uudecode->in_cnt = 0;
      }
      if ((long)local_50 < 1) {
        local_70 = 0;
        sVar12 = local_50;
        sVar13 = 0;
        goto LAB_0013ef7e;
      }
      local_70 = 0;
      sVar13 = 0;
LAB_0013e8b5:
      sVar12 = local_50;
      size = get_line(b,local_50 - sVar13,&local_38);
      if ((long)size < 0) {
        if ((uudecode->state == 0) && ((0 < uudecode->total || (0 < local_70)))) {
          uudecode->state = 4;
          sVar13 = sVar12;
          goto LAB_0013ef7e;
        }
LAB_0013ef28:
        a = self->archive;
        pcVar8 = "Insufficient compressed data";
        iVar2 = -1;
        goto LAB_0013ef3d;
      }
      iVar2 = uudecode->state;
      if (local_38 != 0) {
        if (iVar2 == 1) {
          if ((long)(local_70 + size * 2) < 0x10001) {
            if ((""[*b] != '\0') && (0 < (long)(size - local_38))) {
              uVar3 = *b & 0x3f;
              uVar5 = (ulong)uVar3 ^ 0x20;
              if (uVar5 < size - local_38) {
                if ((char)uVar3 == ' ') {
                  uudecode->state = 2;
                }
                else {
                  pbVar9 = b + 1;
                  lVar4 = 2;
                  lVar6 = 0;
                  do {
                    if ((""[*pbVar9] == '\0') || (""[pbVar9[1]] == '\0')) goto LAB_0013ef28;
                    iVar2 = (pbVar9[1] & 0x3f ^ 0x20) << 0xc;
                    local_68[lVar4 + -2] =
                         (byte)(((*pbVar9 ^ 0x20) << 0x12) >> 0x10) | (byte)((uint)iVar2 >> 0x10);
                    if (uVar5 + lVar6 == 1) {
                      local_70 = (local_70 - lVar6) + 1;
                      local_68 = local_68 + (1 - lVar6);
                      goto LAB_0013e97f;
                    }
                    if (""[pbVar9[2]] == '\0') goto LAB_0013ef28;
                    iVar11 = (pbVar9[2] & 0x3f ^ 0x20) << 6;
                    local_68[lVar4 + -1] = (byte)((uint)iVar2 >> 8) | (byte)((uint)iVar11 >> 8);
                    if (uVar5 + lVar6 == 2) {
                      lVar6 = -lVar6;
                      goto LAB_0013ee62;
                    }
                    if (""[pbVar9[3]] == '\0') goto LAB_0013ef28;
                    local_68[lVar4] = ((byte)iVar11 | pbVar9[3] & 0x3f) ^ 0x20;
                    lVar7 = uVar5 + lVar6;
                    lVar6 = lVar6 + -3;
                    lVar4 = lVar4 + 3;
                    pbVar9 = pbVar9 + 4;
                  } while (3 < lVar7);
                  local_70 = local_70 - lVar6;
                  local_68 = local_68 + -lVar6;
                }
                goto LAB_0013e97f;
              }
            }
            goto LAB_0013ef28;
          }
          goto LAB_0013ef7e;
        }
        if (iVar2 == 2) goto LAB_0013e94e;
        if (iVar2 == 3) {
          if (0x10000 < (long)(local_70 + size * 2)) goto LAB_0013ef7e;
          lVar4 = size - local_38;
          if (2 < lVar4) {
            if (((*b != 0x3d) || (b[1] != 0x3d)) || (b[2] != 0x3d)) goto LAB_0013ea89;
            goto LAB_0013e978;
          }
          pbVar9 = b;
          if (0 < lVar4) {
LAB_0013ea89:
            pbVar9 = b + 2;
            lVar6 = 0;
            lVar7 = 0;
            do {
              bVar10 = pbVar9[-2];
              if ((""[bVar10] == '\0') || (""[pbVar9[-1]] == '\0')) {
                local_70 = local_70 + lVar6;
                local_68 = local_68 + lVar6;
                goto LAB_0013ede7;
              }
              iVar2 = base64num[pbVar9[-1]];
              local_68[lVar6] =
                   (byte)((uint)(base64num[bVar10] << 0x12) >> 0x10) |
                   (byte)((uint)(iVar2 << 0xc) >> 0x10);
              if ((ulong)(lVar4 + lVar7) < 3) {
                local_70 = local_70 + lVar6 + 1;
                lVar4 = lVar4 + lVar7 + -2;
                local_68 = local_68 + lVar6 + 1;
                pbVar9 = b + (2 - lVar7);
                goto LAB_0013eddb;
              }
              uVar5 = (ulong)*pbVar9;
              if (uVar5 == 0x3d) {
                local_70 = local_70 + lVar6 + 1;
                local_68 = local_68 + lVar6 + 1;
                goto LAB_0013e97f;
              }
              if (""[uVar5] == '\0') goto LAB_0013ef28;
              iVar11 = base64num[uVar5];
              local_68[lVar6 + 1] =
                   (byte)((uint)(iVar2 << 0xc) >> 8) | (byte)((uint)(iVar11 << 6) >> 8);
              if ((lVar4 + lVar7 == 3) || (uVar5 = (ulong)pbVar9[1], uVar5 == 0x3d))
              goto LAB_0013ee62;
              if (""[uVar5] == '\0') goto LAB_0013ef28;
              local_68[lVar6 + 2] = (byte)(iVar11 << 6) | (byte)base64num[uVar5];
              lVar1 = lVar4 + lVar7;
              lVar7 = lVar7 + -4;
              pbVar9 = pbVar9 + 4;
              lVar6 = lVar6 + 3;
            } while (4 < lVar1);
            lVar4 = lVar4 + lVar7;
            local_70 = local_70 + lVar6;
            local_68 = local_68 + lVar6;
            pbVar9 = b + -lVar7;
          }
LAB_0013eddb:
          if (lVar4 != 0) {
            bVar10 = *pbVar9;
LAB_0013ede7:
            if (bVar10 != 0x3d) goto LAB_0013ef28;
          }
        }
        else {
          if (0x1ffff < (long)(local_70 + size)) {
            a = self->archive;
            pcVar8 = "Invalid format data";
            goto LAB_0013efd4;
          }
          if (10 < (long)(size - local_38)) {
            if (*(short *)(b + 4) == 0x206e && *(int *)b == 0x69676562) {
              lVar6 = 6;
            }
            else {
              if ((size - local_38 < 0x12) ||
                 (*(long *)(b + 5) != 0x203436657361622d || *(long *)b != 0x61622d6e69676562))
              goto LAB_0013e97f;
              lVar6 = 0xd;
            }
            if (((((b[lVar6] & 0xf8) == 0x30) && ((b[lVar6 + 1] & 0xf8) == 0x30)) &&
                ((b[lVar6 + 2] & 0xf8) == 0x30)) && (b[lVar6 + 3] == 0x20)) {
              uudecode->state =
                   (uint)(*(short *)(b + 4) != 0x206e || *(int *)b != 0x69676562) * 2 + 1;
              uudecode->mode =
                   ((uint)b[lVar6] * 0x40 + (uint)b[lVar6 + 1] * 8 + (uint)b[lVar6 + 2]) - 0xdb0;
              uudecode->mode_set = 1;
              lVar4 = size - (local_38 + lVar6);
              sVar12 = lVar4 - 4;
              if (1 < (long)sVar12) {
                if (uudecode->name != (char *)0x0) {
                  free(uudecode->name);
                }
                pcVar8 = (char *)malloc(lVar4 - 3);
                uudecode->name = pcVar8;
                if (pcVar8 == (char *)0x0) {
                  a = self->archive;
                  pcVar8 = "Can\'t allocate data for uudecode";
                  iVar2 = 0xc;
                  goto LAB_0013ef3d;
                }
                strncpy(pcVar8,(char *)(b + lVar6 + 4),sVar12);
                pcVar8[sVar12] = '\0';
              }
            }
          }
        }
        goto LAB_0013e97f;
      }
      if (iVar2 == 2) {
LAB_0013e94e:
        if ((size - local_38 != 3) || (b[2] != 100 || *(short *)b != 0x6e65)) goto LAB_0013ef28;
LAB_0013e978:
        uudecode->state = 0;
        goto LAB_0013e97f;
      }
      if ((long)local_48 < 1 && local_70 == 0) {
        a = self->archive;
        pcVar8 = "Missing format data";
LAB_0013efd4:
        iVar2 = 0x54;
LAB_0013ef3d:
        archive_set_error(&a->archive,iVar2,pcVar8);
        return -0x1e;
      }
      iVar2 = ensure_in_buff_size(self,uudecode,size);
      if (iVar2 != 0) {
        return -0x1e;
      }
      if (uudecode->in_buff != b) {
        memmove(uudecode->in_buff,b,size);
      }
      uudecode->in_cnt = (int)size;
      if (local_70 != 0) {
        sVar12 = local_50;
        sVar13 = sVar13 + size;
        goto LAB_0013ef7e;
      }
      __archive_read_filter_consume(self->upstream,local_48);
      b = (byte *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_50);
      bVar14 = b == (byte *)0x0;
    } while (!bVar14 || -1 < (long)local_50);
  }
  return -0x1e;
LAB_0013ee62:
  local_68 = local_68 + lVar6 + 2;
  local_70 = local_70 + lVar6 + 2;
LAB_0013e97f:
  b = b + size;
  sVar13 = sVar13 + size;
  sVar12 = local_50;
  if ((long)local_50 <= (long)sVar13) goto LAB_0013ef7e;
  goto LAB_0013e8b5;
}

Assistant:

static ssize_t
uudecode_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct uudecode *uudecode;
	const unsigned char *b, *d;
	unsigned char *out;
	ssize_t avail_in, ravail;
	ssize_t used;
	ssize_t total;
	ssize_t len, llen, nl, namelen;

	uudecode = (struct uudecode *)self->data;

read_more:
	d = __archive_read_filter_ahead(self->upstream, 1, &avail_in);
	if (d == NULL && avail_in < 0)
		return (ARCHIVE_FATAL);
	/* Quiet a code analyzer; make sure avail_in must be zero
	 * when d is NULL. */
	if (d == NULL)
		avail_in = 0;
	used = 0;
	total = 0;
	out = uudecode->out_buff;
	ravail = avail_in;
	if (uudecode->state == ST_IGNORE) {
		used = avail_in;
		goto finish;
	}
	if (uudecode->in_cnt) {
		/*
		 * If there is remaining data which is saved by
		 * previous calling, use it first.
		 */
		if (ensure_in_buff_size(self, uudecode,
		    avail_in + uudecode->in_cnt) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		#ifdef __clang_analyzer__
		assert(d);
		#endif
		memcpy(uudecode->in_buff + uudecode->in_cnt,
		    d, avail_in);
		d = uudecode->in_buff;
		avail_in += uudecode->in_cnt;
		uudecode->in_cnt = 0;
	}
	for (;used < avail_in; d += llen, used += llen) {
		int64_t l, body;

		b = d;
		len = get_line(b, avail_in - used, &nl);
		if (len < 0) {
			/* Non-ascii character is found. */
			if (uudecode->state == ST_FIND_HEAD &&
			    (uudecode->total > 0 || total > 0)) {
				uudecode->state = ST_IGNORE;
				used = avail_in;
				goto finish;
			}
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Insufficient compressed data");
			return (ARCHIVE_FATAL);
		}
		llen = len;
		if ((nl == 0) && (uudecode->state != ST_UUEND)) {
			if (total == 0 && ravail <= 0) {
				/* There is nothing more to read, fail */
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Missing format data");
				return (ARCHIVE_FATAL);
			}
			/*
			 * Save remaining data which does not contain
			 * NL('\n','\r').
			 */
			if (ensure_in_buff_size(self, uudecode, len)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			if (uudecode->in_buff != b)
				memmove(uudecode->in_buff, b, len);
			uudecode->in_cnt = (int)len;
			if (total == 0) {
				/* Do not return 0; it means end-of-file.
				 * We should try to read bytes more. */
				__archive_read_filter_consume(
				    self->upstream, ravail);
				goto read_more;
			}
			used += len;
			break;
		}
		switch (uudecode->state) {
		default:
		case ST_FIND_HEAD:
			/* Do not read more than UUENCODE_BID_MAX_READ bytes */
			if (total + len >= UUENCODE_BID_MAX_READ) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Invalid format data");
				return (ARCHIVE_FATAL);
			}
			if (len - nl >= 11 && memcmp(b, "begin ", 6) == 0)
				l = 6;
			else if (len - nl >= 18 &&
			    memcmp(b, "begin-base64 ", 13) == 0)
				l = 13;
			else
				l = 0;
			if (l != 0 && b[l] >= '0' && b[l] <= '7' &&
			    b[l+1] >= '0' && b[l+1] <= '7' &&
			    b[l+2] >= '0' && b[l+2] <= '7' && b[l+3] == ' ') {
				if (l == 6)
					uudecode->state = ST_READ_UU;
				else
					uudecode->state = ST_READ_BASE64;
				uudecode->mode = (mode_t)(
				    ((int)(b[l] - '0') * 64) +
				    ((int)(b[l+1] - '0') * 8) +
				     (int)(b[l+2] - '0'));
				uudecode->mode_set = 1;
				namelen = len - nl - 4 - l;
				if (namelen > 1) {
					if (uudecode->name != NULL)
						free(uudecode->name);
					uudecode->name = malloc(namelen + 1);
			                if (uudecode->name == NULL) {
					archive_set_error(
					    &self->archive->archive,
					    ENOMEM,
					    "Can't allocate data for uudecode");
						return (ARCHIVE_FATAL);
					}
					strncpy(uudecode->name,
					    (const char *)(b + l + 4),
					    namelen);
					uudecode->name[namelen] = '\0';
				}
			}
			break;
		case ST_READ_UU:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			body = len - nl;
			if (!uuchar[*b] || body <= 0) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			/* Get length of undecoded bytes of current line. */
			l = UUDECODE(*b++);
			body--;
			if (l > body) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			if (l == 0) {
				uudecode->state = ST_UUEND;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (!uuchar[b[0]] || !uuchar[b[1]])
					break;
				n = UUDECODE(*b++) << 18;
				n |= UUDECODE(*b++) << 12;
				*out++ = n >> 16; total++;
				--l;

				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++) << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++);
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_UUEND:
			if (len - nl == 3 && memcmp(b, "end ", 3) == 0)
				uudecode->state = ST_FIND_HEAD;
			else {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_READ_BASE64:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			l = len - nl;
			if (l >= 3 && b[0] == '=' && b[1] == '=' &&
			    b[2] == '=') {
				uudecode->state = ST_FIND_HEAD;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (!base64[b[0]] || !base64[b[1]])
					break;
				n = base64num[*b++] << 18;
				n |= base64num[*b++] << 12;
				*out++ = n >> 16; total++;
				l -= 2;

				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++] << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++];
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l && *b != '=') {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		}
	}
finish:
	if (ravail < avail_in)
		used -= avail_in - ravail;
	__archive_read_filter_consume(self->upstream, used);

	*buff = uudecode->out_buff;
	uudecode->total += total;
	return (total);
}